

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O1

void asm_collectargs(ASMState *as,IRIns *ir,CCallInfo *ci,IRRef *args)

{
  IRIns *pIVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = ci->flags & 0xff;
  if ((ci->flags >> 8 & 1) != 0) {
    *args = 0x7fff;
    args = args + 1;
    uVar2 = uVar2 - 1;
  }
  if (1 < uVar2) {
    pIVar1 = as->ir;
    uVar3 = (ulong)uVar2;
    do {
      ir = pIVar1 + (ir->field_0).op1;
      uVar2 = (uint)(ir->field_0).op2;
      if ((ir->field_0).op2 == 0x7fff) {
        uVar2 = 0;
      }
      args[uVar3 - 1] = uVar2;
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  uVar2 = 0;
  if ((ir->field_0).op1 != 0x7fff) {
    uVar2 = (uint)(ir->field_0).op1;
  }
  *args = uVar2;
  return;
}

Assistant:

static void asm_collectargs(ASMState *as, IRIns *ir,
			    const CCallInfo *ci, IRRef *args)
{
  uint32_t n = CCI_XNARGS(ci);
  /* Account for split args. */
  lj_assertA(n <= CCI_NARGS_MAX*2, "too many args %d to collect", n);
  if ((ci->flags & CCI_L)) { *args++ = ASMREF_L; n--; }
  while (n-- > 1) {
    ir = IR(ir->op1);
    lj_assertA(ir->o == IR_CARG, "malformed CALL arg tree");
    args[n] = ir->op2 == REF_NIL ? 0 : ir->op2;
  }
  args[0] = ir->op1 == REF_NIL ? 0 : ir->op1;
  lj_assertA(IR(ir->op1)->o != IR_CARG, "malformed CALL arg tree");
}